

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlylinkedlist.c
# Opt level: O3

int singlylinkedlist_foreach
              (SINGLYLINKEDLIST_HANDLE list,LIST_ACTION_FUNCTION action_function,
              void *action_context)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  LIST_ITEM_INSTANCE *pLVar3;
  _Bool continue_processing;
  
  if (list == (SINGLYLINKEDLIST_HANDLE)0x0 || action_function == (LIST_ACTION_FUNCTION)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x15a;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/singlylinkedlist.c"
                ,"singlylinkedlist_foreach",0x159,1,"Invalid argument (list=%p, action_function=%p)"
                ,list,action_function);
    }
  }
  else {
    pLVar3 = list->head;
    iVar2 = 0;
    if (pLVar3 != (LIST_ITEM_INSTANCE *)0x0) {
      do {
        continue_processing = false;
        (*action_function)(pLVar3->item,action_context,&continue_processing);
        if (continue_processing == false) {
          return 0;
        }
        pLVar3 = (LIST_ITEM_INSTANCE *)pLVar3->next;
        iVar2 = 0;
      } while (pLVar3 != (LIST_ITEM_INSTANCE *)0x0);
    }
  }
  return iVar2;
}

Assistant:

int singlylinkedlist_foreach(SINGLYLINKEDLIST_HANDLE list, LIST_ACTION_FUNCTION action_function, const void* action_context)
{
    int result;

    /* Codes_SRS_LIST_09_008: [ If the list or the action_function argument is NULL, singlylinkedlist_foreach shall return non-zero value. ] */
    if ((list == NULL) ||
        (action_function == NULL))
    {
        LogError("Invalid argument (list=%p, action_function=%p)", list, action_function);
        result = MU_FAILURE;
    }
    else
    {
        LIST_INSTANCE* list_instance = (LIST_INSTANCE*)list;
        LIST_ITEM_INSTANCE* list_item = list_instance->head;

        while (list_item != NULL)
        {
            bool continue_processing = false;

            /* Codes_SRS_LIST_09_009: [ singlylinkedlist_foreach shall iterate through all items in a list and invoke action_function for each one of them. ] */
            action_function(list_item->item, action_context, &continue_processing);

            /* Codes_SRS_LIST_09_010: [ If the condition function returns continue_processing as false, singlylinkedlist_foreach shall stop iterating through the list and return. ] */
            if (continue_processing == false)
            {
                break;
            }

            list_item = (LIST_ITEM_INSTANCE*)list_item->next;
        }

        /* Codes_SRS_LIST_09_011: [ If no errors occur, singlylinkedlist_foreach shall return zero. ] */
        result = 0;
    }

    return result;
}